

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char8_t,std::char_traits<char8_t>>,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,char8_t>
          (pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
          begin,__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                end,char8_t in_whitespace)

{
  long lVar1;
  jessilib *pjVar2;
  jessilib jVar3;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  _Var4;
  size_t sVar5;
  jessilib *pjVar6;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  _Var7;
  
  jVar3 = SUB81(end._M_current,0);
  if (begin._M_current <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char8_t *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char8_t *)0x0;
    return __return_storage_ptr__;
  }
  do {
    _Var4._M_current = (char8_t *)this;
    if (*this != jVar3) break;
    this = this + 1;
    _Var4._M_current = begin._M_current;
  } while (this != (jessilib *)begin._M_current);
  if (_Var4._M_current != begin._M_current) {
    sVar5 = 0;
    do {
      if (((jessilib *)_Var4._M_current)[sVar5] == jVar3) {
        pjVar2 = (jessilib *)_Var4._M_current + sVar5 + 1;
        goto LAB_0040ad05;
      }
      lVar1 = sVar5 + 1;
      sVar5 = sVar5 + 1;
    } while ((jessilib *)_Var4._M_current + lVar1 != (jessilib *)begin._M_current);
  }
  (__return_storage_ptr__->first)._M_len = (long)begin._M_current - (long)_Var4._M_current;
  (__return_storage_ptr__->first)._M_str = _Var4._M_current;
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char8_t *)0x0;
  return __return_storage_ptr__;
  while (pjVar2 = pjVar6 + 1, _Var7._M_current = (char8_t *)pjVar6, *pjVar6 == jVar3) {
LAB_0040ad05:
    pjVar6 = pjVar2;
    _Var7._M_current = begin._M_current;
    if (pjVar6 == (jessilib *)begin._M_current) break;
  }
  (__return_storage_ptr__->first)._M_len = sVar5;
  (__return_storage_ptr__->first)._M_str = _Var4._M_current;
  (__return_storage_ptr__->second)._M_len = (long)begin._M_current - (long)_Var7._M_current;
  (__return_storage_ptr__->second)._M_str = _Var7._M_current;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}